

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_poly.c
# Opt level: O2

mpt_metatype * mpt_iterator_poly(char *desc,mpt_array *base)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  char *pcVar4;
  ulong uVar5;
  mpt_metatype *pmVar6;
  int *piVar7;
  mpt_buffer *pmVar8;
  ulong uVar9;
  ulong uVar10;
  double *pdVar11;
  mpt_buffer **ppmVar12;
  size_t __n;
  bool bVar13;
  mpt_buffer *apmStack_848 [2];
  coeff_poly coeff [128];
  
  ppmVar12 = apmStack_848;
  pmVar8 = base->_buf;
  if ((pmVar8 != (mpt_buffer *)0x0) &&
     (lVar3 = (**(code **)(((_mpt_vptr_convertable *)&pmVar8->_vptr)->convert + 0x10))(pmVar8),
     lVar3 == 0)) {
    return (mpt_metatype *)0x0;
  }
  if (desc == (char *)0x0) {
    uVar9 = 0;
  }
  else {
    pdVar11 = &coeff[0].mult;
    uVar9 = 0;
    do {
      uVar2 = mpt_cdouble(pdVar11,desc,0);
      if ((int)uVar2 < 1) {
        if (uVar9 == 0) {
          if (pmVar8 != (mpt_buffer *)0x0) {
            (**(code **)(((_mpt_vptr_convertable *)&pmVar8->_vptr)->convert + 8))(pmVar8);
          }
          piVar7 = __errno_location();
          *piVar7 = 0x16;
          return (mpt_metatype *)0x0;
        }
        goto LAB_00109393;
      }
      desc = desc + uVar2;
      uVar9 = uVar9 + 1;
      pdVar11 = pdVar11 + 2;
    } while (uVar9 != 0x80);
    uVar9 = 0x80;
LAB_00109393:
    pcVar4 = strchr(desc,0x3a);
    if (pcVar4 != (char *)0x0) {
      pcVar4 = pcVar4 + 1;
      iVar1 = 1;
      if (1 < (int)uVar9) {
        iVar1 = (int)uVar9;
      }
      uVar10 = (ulong)(iVar1 - 1U);
      uVar5 = 0xffffffffffffffff;
      apmStack_848[1] = pmVar8;
      do {
        ppmVar12 = (mpt_buffer **)((long)ppmVar12 + 0x10);
        bVar13 = uVar10 == 0;
        uVar10 = uVar10 - 1;
        if (bVar13) {
          uVar5 = (ulong)(iVar1 - 1U);
          pmVar8 = apmStack_848[1];
          break;
        }
        uVar2 = mpt_cdouble(ppmVar12,pcVar4,0);
        pcVar4 = pcVar4 + uVar2;
        uVar5 = (ulong)((int)uVar5 + 1);
        pmVar8 = apmStack_848[1];
      } while (0 < (int)uVar2);
      goto LAB_001093f7;
    }
  }
  uVar5 = 0;
LAB_001093f7:
  ppmVar12 = apmStack_848 + uVar5 * 2;
  for (; ppmVar12 = ppmVar12 + 2, uVar5 < (uVar9 & 0xffffffff); uVar5 = uVar5 + 1) {
    *ppmVar12 = (mpt_buffer *)0x0;
  }
  __n = (long)(int)uVar9 * 0x10;
  pmVar6 = (mpt_metatype *)malloc(__n + 0x40);
  if (pmVar6 == (mpt_metatype *)0x0) {
    if (pmVar8 != (mpt_buffer *)0x0) {
      (**(code **)(((_mpt_vptr_convertable *)&pmVar8->_vptr)->convert + 8))(pmVar8);
    }
    return (mpt_metatype *)0x0;
  }
  pmVar6->_vptr = &mpt_iterator_poly::polyMeta;
  pmVar6[1]._vptr = (_mpt_vptr_metatype *)&mpt_iterator_poly::polyIter;
  pmVar6[2]._vptr = (_mpt_vptr_metatype *)0x0;
  pmVar6[3]._vptr = (_mpt_vptr_metatype *)0x0;
  pmVar6[5]._vptr = (_mpt_vptr_metatype *)pmVar8;
  pmVar6[6]._vptr = (_mpt_vptr_metatype *)0x0;
  *(int *)&pmVar6[7]._vptr = (int)uVar9;
  memcpy(pmVar6 + 8,coeff,__n);
  return pmVar6;
}

Assistant:

extern MPT_INTERFACE(metatype) *mpt_iterator_poly(const char *desc, const _MPT_ARRAY_TYPE(double) *base)
{
	static const MPT_INTERFACE_VPTR(metatype) polyMeta = {
		{ iterPolyConv },
		iterPolyUnref,
		iterPolyRef,
		iterPolyClone
	};
	static const MPT_INTERFACE_VPTR(iterator) polyIter = {
		iterPolyValue,
		iterPolyAdvance,
		iterPolyReset
	};
	MPT_STRUCT(iteratorPolynom) *data;
	MPT_STRUCT(buffer) *buf;
	struct coeff_poly coeff[128];
	int nc = 0, ns = sizeof(coeff)/sizeof(*coeff);
	
	if ((buf = base->_buf)
	    && !buf->_vptr->addref(buf)) {
		return 0;
	}
	/* polynom coefficients */
	if (desc) {
		do {
			ssize_t len = mpt_cdouble(&coeff[nc].mult, desc, 0);
			
			if (len <= 0) {
				if (!nc) {
					if (buf) {
						buf->_vptr->unref(buf);
					}
					errno = EINVAL;
					return 0;
				}
				break;
			}
			desc += len;
		} while (++nc < ns);
	}
	/* variable shift */
	ns = 0;
	if (nc && (desc = strchr(desc, ':'))) {
		int max = nc - 1;
		++desc;
		while (ns < max) {
			ssize_t len = mpt_cdouble(&coeff[ns].shift, desc, 0);
			
			if (len <= 0) {
				break;
			}
			desc += len;
			++ns;
		}
	}
	for ( ; ns < nc; ++ns) {
		coeff[ns].shift = 0;
	}
	if (!(data = malloc(sizeof(*data) + nc * sizeof(*coeff)))) {
		if (buf) {
			buf->_vptr->unref(buf);
		}
		return 0;
	}
	data->_mt._vptr = &polyMeta;
	data->_it._vptr = &polyIter;
	
	MPT_value_set(&data->val, 0, 0);
	
	data->grid._buf = buf;
	data->pos = 0;
	data->coeff = nc;
	memcpy(data + 1, coeff, nc * sizeof(*coeff));
	
	return &data->_mt;
}